

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

Read<int> __thiscall Omega_h::Mesh::owned_array<int>(Mesh *this,Int ent_dim,Read<int> *a,Int width)

{
  void **this_00;
  bool bVar1;
  LO LVar2;
  undefined4 in_register_0000000c;
  Read<int> *pRVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar4;
  undefined4 in_register_00000034;
  int in_R8D;
  Read<int> RVar5;
  Read<int> local_c0;
  Read<int> local_b0;
  Write<int> local_a0 [2];
  Read<signed_char> local_80;
  undefined1 local_70 [8];
  LOs o2e;
  Read<signed_char> o;
  Int width_local;
  Read<int> *a_local;
  Int ent_dim_local;
  Mesh *this_local;
  ulong local_10;
  
  pRVar3 = (Read<int> *)CONCAT44(in_register_0000000c,width);
  if (((ulong)(pRVar3->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((pRVar3->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(pRVar3->write_).shared_alloc_.alloc >> 3;
  }
  LVar2 = nents((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
  if ((int)(local_10 >> 2) == in_R8D * LVar2) {
    bVar1 = could_be_shared((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
    if (bVar1) {
      this_00 = &o2e.write_.shared_alloc_.direct_ptr;
      owned((Mesh *)this_00,ent_dim);
      Read<signed_char>::Read(&local_80,(Read<signed_char> *)this_00);
      collect_marked((Omega_h *)local_70,&local_80);
      Read<signed_char>::~Read(&local_80);
      Read<int>::Read(&local_b0,(Read<int> *)local_70);
      Read<int>::Read(&local_c0,pRVar3);
      unmap<int>((Omega_h *)local_a0,&local_b0,&local_c0,in_R8D);
      Read<int>::Read((Read<int> *)this,local_a0);
      Write<int>::~Write(local_a0);
      Read<int>::~Read(&local_c0);
      Read<int>::~Read(&local_b0);
      Read<int>::~Read((Read<int> *)local_70);
      Read<signed_char>::~Read((Read<signed_char> *)&o2e.write_.shared_alloc_.direct_ptr);
      pvVar4 = extraout_RDX_00;
    }
    else {
      Read<int>::Read((Read<int> *)this,pRVar3);
      pvVar4 = extraout_RDX;
    }
    RVar5.write_.shared_alloc_.direct_ptr = pvVar4;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<int>)RVar5.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == width * nents(ent_dim)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp"
       ,0x267);
}

Assistant:

Read<T> Mesh::owned_array(Int ent_dim, Read<T> a, Int width) {
  OMEGA_H_CHECK(a.size() == width * nents(ent_dim));
  if (!could_be_shared(ent_dim)) return a;
  auto o = owned(ent_dim);
  auto o2e = collect_marked(o);
  return unmap(o2e, a, width);
}